

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

int __thiscall embree::Stream<int>::get(Stream<int> *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  runtime_error *this_00;
  uint uVar4;
  ParseLocation l;
  pair<int,_embree::ParseLocation> local_38;
  
  sVar3 = this->future;
  if (sVar3 == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&l,this);
    local_38.first = (*(this->super_RefCount)._vptr_RefCount[4])(this);
    ParseLocation::ParseLocation(&local_38.second,&l);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&l.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    sVar3 = this->past;
    sVar2 = this->future;
    if (sVar2 + sVar3 == 0x400) {
      if (sVar3 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar4 = (int)this->start + 1U & 0x3ff;
      this->start = (ulong)uVar4;
      sVar3 = sVar3 - 1;
      this->past = sVar3;
    }
    else {
      uVar4 = (uint)this->start;
    }
    this->future = sVar2 + 1;
    std::pair<int,_embree::ParseLocation>::operator=
              ((this->buffer).
               super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
               ._M_impl.super__Vector_impl_data._M_start + ((int)sVar3 + uVar4 + (int)sVar2 & 0x3ff)
               ,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.second.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    sVar3 = this->future;
  }
  iVar1 = (this->buffer).
          super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)this->start + (int)this->past & 0x3ff].
          first;
  this->past = this->past + 1;
  this->future = sVar3 - 1;
  return iVar1;
}

Assistant:

T get() {
      if (future == 0) push_back(nextHelper());
      T t = buffer[(start+past)%BUF_SIZE].first;
      past++; future--;
      return t;
    }